

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::ReadNLString<TestNLHandler3>
          (mp *this,NLStringRef str,TestNLHandler3 *handler,CStringRef name,int flags)

{
  ReadError *this_00;
  TestNLHandler3 *handler_00;
  int flags_00;
  NLStringRef data;
  TextReader<fmt::Locale> reader;
  TextReader<fmt::Locale> TStack_1b8;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> local_160;
  NLHeader local_140;
  
  handler_00 = (TestNLHandler3 *)str.size_;
  data.size_ = (size_t)str.data_;
  data.data_ = (char *)this;
  internal::TextReader<fmt::Locale>::TextReader(&TStack_1b8,data,(CStringRef)handler);
  memset(&local_140,0,0x110);
  local_140.super_NLInfo.super_NLInfo_C.format = 1;
  local_140.super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  local_140.super_NLInfo.super_NLInfo_C.prob_name = "nl_instance";
  local_140.super_NLInfo.super_NLInfo_C.ampl_vbtol = 0.0;
  local_140.super_NLInfo.super_NLInfo_C.arith_kind = 1;
  local_140.super_NLInfo.super_NLInfo_C.flags = 1;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[3] = 0;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[4] = 0;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[5] = 0;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[6] = 0;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[7] = 0;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[8] = 0;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[2] = 0;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[0] = 1;
  local_140.super_NLInfo.super_NLInfo_C.ampl_options[1] = 1;
  internal::TextReader<fmt::Locale>::ReadHeader(&TStack_1b8,&local_140);
  flags_00 = (int)name.data_;
  if (local_140.super_NLInfo.super_NLInfo_C.format == 0) {
    local_160.num_vars_and_exprs_ = 0;
    local_160.reader_ = &TStack_1b8;
    local_160.header_ = &local_140;
    local_160.handler_ = handler_00;
    local_160.flags_ = flags_00;
    internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::Read(&local_160);
  }
  else if (local_140.super_NLInfo.super_NLInfo_C.format == 1) {
    if (local_140.super_NLInfo.super_NLInfo_C.arith_kind == 1) {
      internal::ReadBinary<mp::internal::IdentityConverter,TestNLHandler3>
                (&TStack_1b8,&local_140,handler_00,flags_00);
    }
    else {
      if (1 < local_140.super_NLInfo.super_NLInfo_C.arith_kind - 1U) {
        this_00 = (ReadError *)__cxa_allocate_exception(0x40);
        ReadError::ReadError<>(this_00,(CStringRef)handler,0,0,(CStringRef)0x26c081);
        __cxa_throw(this_00,&ReadError::typeinfo,ReadError::~ReadError);
      }
      internal::ReadBinary<mp::internal::EndiannessConverter,TestNLHandler3>
                (&TStack_1b8,&local_140,handler_00,flags_00);
    }
  }
  freelocale((__locale_t)TStack_1b8.locale_.super_Locale.locale_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)TStack_1b8.super_ReaderBase.name_._M_dataplus._M_p !=
      &TStack_1b8.super_ReaderBase.name_.field_2) {
    operator_delete(TStack_1b8.super_ReaderBase.name_._M_dataplus._M_p,
                    TStack_1b8.super_ReaderBase.name_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ReadNLString(NLStringRef str, Handler &handler,
                  fmt::CStringRef name, int flags) {
  // If handler is a Problem-like object (Problem::Builder type is defined)
  // then use ProblemBuilder API to populate it.
  typedef internal::NLAdapter<
      Handler, internal::HasBuilder<Handler>::value> Adapter;
  typename Adapter::RefType adapter(handler);
  internal::TextReader<> reader(str, name);
  NLHeader header = NLHeader();
  reader.ReadHeader(header);
  adapter.OnHeader(header);
  switch (header.format) {
  case NLHeader::TEXT:
    internal::NLReader<internal::TextReader<>, typename Adapter::Type>(
          reader, header, adapter, flags).Read();
    break;
  case NLHeader::BINARY: {
      using internal::ReadBinary;
    arith::Kind arith_kind = arith::GetKind();
    if (arith_kind == header.arith_kind) {
      ReadBinary<internal::IdentityConverter>(reader, header, adapter, flags);
      break;
    }
    if (!IsIEEE(arith_kind)
        || !IsIEEE((arith::Kind)header.arith_kind))
      throw ReadError(name, 0, 0, "unsupported floating-point arithmetic");
    ReadBinary<internal::EndiannessConverter>(reader, header, adapter, flags);
    break;
  }
  }
}